

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_pickmode.c
# Opt level: O3

void model_rd_for_sb_y(AV1_COMP *cpi,BLOCK_SIZE bsize,MACROBLOCK *x,MACROBLOCKD *xd,
                      RD_STATS *rd_stats,uint *var_out,int calculate_rd,int *early_term)

{
  int iVar1;
  uint uVar2;
  RD_STATS *pRVar3;
  ulong uVar4;
  TX_SIZE TVar5;
  uint var;
  int iVar6;
  byte bVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  char cVar11;
  ulong uVar12;
  double dVar13;
  double sse_norm;
  uint sse;
  double rate_f;
  int local_70;
  uint local_6c;
  MACROBLOCK *local_68;
  long local_60;
  RD_STATS *local_58;
  double local_50;
  ulong local_48;
  double local_40;
  double local_38;
  
  if ((early_term != (int *)0x0) && (x->force_zeromv_skip_for_blk != 0)) {
    *early_term = 1;
    rd_stats->rate = 0;
    rd_stats->dist = 0;
    rd_stats->sse = 0;
  }
  local_60 = (long)(*xd->mi)->ref_frame[0];
  local_58 = rd_stats;
  var = (*cpi->ppi->fn_ptr[bsize].vf)
                  (x->plane[0].src.buf,x->plane[0].src.stride,xd->plane[0].dst.buf,
                   xd->plane[0].dst.stride,&local_6c);
  uVar2 = local_6c;
  local_70 = 0;
  uVar12 = (ulong)local_6c;
  local_48 = (ulong)bsize;
  TVar5 = calculate_tx_size(cpi,bsize,x,var,local_6c,&local_70);
  uVar4 = local_48;
  pRVar3 = local_58;
  lVar10 = local_60;
  iVar1 = local_70;
  (*xd->mi)->tx_size = TVar5;
  if (var_out != (uint *)0x0) {
    *var_out = var;
  }
  lVar9 = 0x7fffffff;
  iVar8 = 0x7fffffff;
  cVar11 = (char)local_60;
  if ((calculate_rd != 0) && ((local_70 == 0 || (cVar11 == '\0')))) {
    bVar7 = 3;
    if ((((x->e_mbd).cur_buf)->flags & 8) != 0) {
      bVar7 = (char)(x->e_mbd).bd - 5;
    }
    if (uVar2 == 0) {
      uVar12 = 0;
      iVar8 = 0;
      lVar9 = 0;
    }
    else {
      iVar6 = (int)x->plane[0].dequant_QTX[1] >> (bVar7 & 0x1f);
      iVar8 = 1;
      if (1 < iVar6) {
        iVar8 = iVar6;
      }
      local_50 = (double)((uint)block_size_high[local_48] * (uint)block_size_wide[local_48]);
      sse_norm = (double)uVar2 / local_50;
      local_68 = x;
      dVar13 = log2(sse_norm / ((double)iVar8 * (double)iVar8));
      av1_model_rd_curvfit((BLOCK_SIZE)uVar4,sse_norm,dVar13,&local_38,&local_40);
      dVar13 = 0.0;
      if (0.0 <= local_38 * local_50) {
        dVar13 = local_38 * local_50;
      }
      iVar6 = (int)(dVar13 + 0.5);
      if (iVar6 == 0) {
        lVar9 = uVar12 << 4;
        iVar8 = 0;
      }
      else {
        local_50 = sse_norm * local_40 * local_50;
        dVar13 = 0.0;
        if (0.0 <= local_50) {
          dVar13 = local_50;
        }
        lVar9 = uVar12 << 4;
        iVar8 = 0;
        if ((long)(dVar13 + 0.5) * 0x80 + ((long)local_68->rdmult * (long)iVar6 + 0x100 >> 9) <
            (long)(uVar12 * 0x800)) {
          lVar9 = (long)(dVar13 + 0.5);
          iVar8 = iVar6;
        }
      }
      uVar12 = (ulong)local_6c;
      x = local_68;
    }
  }
  pRVar3->sse = uVar12;
  x->pred_sse[lVar10] = (uint)uVar12;
  lVar10 = uVar12 << 4;
  iVar6 = 0;
  if (iVar1 == 0 || cVar11 < '\x01') {
    lVar10 = lVar9;
    iVar6 = iVar8;
  }
  pRVar3->skip_txfm = iVar6 == 0;
  pRVar3->rate = iVar6;
  pRVar3->dist = lVar10;
  return;
}

Assistant:

static void model_rd_for_sb_y(const AV1_COMP *const cpi, BLOCK_SIZE bsize,
                              MACROBLOCK *x, MACROBLOCKD *xd,
                              RD_STATS *rd_stats, unsigned int *var_out,
                              int calculate_rd, int *early_term) {
  if (x->force_zeromv_skip_for_blk && early_term != NULL) {
    *early_term = 1;
    rd_stats->rate = 0;
    rd_stats->dist = 0;
    rd_stats->sse = 0;
  }

  // Note our transform coeffs are 8 times an orthogonal transform.
  // Hence quantizer step is also 8 times. To get effective quantizer
  // we need to divide by 8 before sending to modeling function.
  const int ref = xd->mi[0]->ref_frame[0];

  assert(bsize < BLOCK_SIZES_ALL);

  struct macroblock_plane *const p = &x->plane[AOM_PLANE_Y];
  struct macroblockd_plane *const pd = &xd->plane[AOM_PLANE_Y];
  unsigned int sse;
  int rate;
  int64_t dist;

  unsigned int var = cpi->ppi->fn_ptr[bsize].vf(
      p->src.buf, p->src.stride, pd->dst.buf, pd->dst.stride, &sse);
  int force_skip = 0;
  xd->mi[0]->tx_size = calculate_tx_size(cpi, bsize, x, var, sse, &force_skip);
  if (var_out) {
    *var_out = var;
  }

  if (calculate_rd && (!force_skip || ref == INTRA_FRAME)) {
    const int bwide = block_size_wide[bsize];
    const int bhigh = block_size_high[bsize];
    model_rd_with_curvfit(cpi, x, bsize, AOM_PLANE_Y, sse, bwide * bhigh, &rate,
                          &dist);
  } else {
    rate = INT_MAX;  // this will be overwritten later with av1_block_yrd
    dist = INT_MAX;
  }
  rd_stats->sse = sse;
  x->pred_sse[ref] = (unsigned int)AOMMIN(sse, UINT_MAX);

  if (force_skip && ref > INTRA_FRAME) {
    rate = 0;
    dist = (int64_t)sse << 4;
  }

  assert(rate >= 0);

  rd_stats->skip_txfm = (rate == 0);
  rate = AOMMIN(rate, INT_MAX);
  rd_stats->rate = rate;
  rd_stats->dist = dist;
}